

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O3

void __thiscall OpenMD::ForceManager::initialize(ForceManager *this)

{
  InteractionManager *this_00;
  pointer pcVar1;
  ForceField *pFVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  int iVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ZConstraintForceModifier *pZVar8;
  Globals *pGVar9;
  locale *plVar10;
  LightParameters *pLVar11;
  ulong uVar12;
  SimInfo *pSVar13;
  long lVar14;
  string ensembleParam;
  undefined1 auStack_68 [8];
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  if (this->info_->topologyDone_ == false) {
    SimInfo::update(this->info_);
    this_00 = this->interactionMan_;
    this_00->info_ = this->info_;
    InteractionManager::initialize(this_00);
    this->useSurfaceTerm_ = false;
    this->useSlabGeometry_ = false;
    (*this->_vptr_ForceManager[4])(this);
    SimInfo::prepareTopology(this->info_);
    pGVar9 = this->info_->simParams_;
    this->doParticlePot_ = (bool)(pGVar9->OutputParticlePotential).super_ParameterBase.field_0x2b;
    bVar5 = (bool)(pGVar9->PrintHeatFlux).super_ParameterBase.field_0x2b;
    this->doHeatFlux_ = bVar5;
    if (bVar5 == true) {
      this->doParticlePot_ = true;
    }
    this->doElectricField_ = (bool)(pGVar9->OutputElectricField).super_ParameterBase.field_0x2b;
    bVar5 = RNEMD::RNEMDParameters::requiresElectricField(pGVar9->rnemdPars_);
    this->doElectricField_ = (bool)(this->doElectricField_ | bVar5);
    pSVar13 = this->info_;
    pGVar9 = pSVar13->simParams_;
    this->doSitePotential_ = (bool)(pGVar9->OutputSitePotential).super_ParameterBase.field_0x2b;
    if (((pGVar9->UseSurfaceTerm).super_ParameterBase.empty_ == false) &&
       ((pGVar9->UseSurfaceTerm).super_ParameterBase.field_0x2b == '\x01')) {
      if (pSVar13->usesElectrostaticAtoms_ == true) {
        this->useSurfaceTerm_ = true;
        if ((pGVar9->UseSlabGeometry).super_ParameterBase.empty_ == false) {
          bVar5 = (bool)(pGVar9->UseSlabGeometry).super_ParameterBase.field_0x2b;
          plVar10 = (locale *)CONCAT71((int7)((ulong)pSVar13 >> 8),bVar5);
          this->useSlabGeometry_ = bVar5;
          pcVar1 = (pGVar9->PrivilegedAxis).data_._M_dataplus._M_p;
          local_60._0_8_ = (ForceModifier *)local_50;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_60,pcVar1,
                     pcVar1 + (pGVar9->PrivilegedAxis).data_._M_string_length);
          std::locale::locale((locale *)auStack_68);
          toUpperCopy<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_50 + 0x10),(OpenMD *)local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_68
                     ,plVar10);
          std::locale::~locale((locale *)auStack_68);
          if ((ForceModifier *)local_60._0_8_ != (ForceModifier *)local_50) {
            operator_delete((void *)local_60._0_8_,local_50._0_8_ + 1);
          }
          iVar6 = std::__cxx11::string::compare(local_50 + 0x10);
          if (iVar6 == 0) {
            this->axis_ = 0;
          }
          else {
            iVar6 = std::__cxx11::string::compare(local_50 + 0x10);
            if (iVar6 == 0) {
              this->axis_ = 1;
            }
            else {
              this->axis_ = 2;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._16_8_ != &local_30) {
            operator_delete((void *)local_50._16_8_,local_30._M_allocated_capacity + 1);
          }
        }
      }
      else {
        memcpy(&painCave,
               "ForceManager::initialize : useSurfaceTerm was set true\n\tbut no electrostatic atoms are present. OpenMD will\n\tignore this setting.\n"
               ,0x83);
        painCave.isFatal = 0;
        painCave.severity = 2;
        simError();
      }
    }
  }
  pFVar2 = this->forceField_;
  std::vector<double,_std::allocator<double>_>::reserve(&this->vdwScale_,4);
  pdVar3 = (this->vdwScale_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->vdwScale_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar3 != pdVar4) {
    memset(pdVar3,0,((long)pdVar4 + (-8 - (long)pdVar3) & 0xfffffffffffffff8U) + 8);
  }
  std::vector<double,_std::allocator<double>_>::reserve(&this->electrostaticScale_,4);
  pdVar3 = (this->electrostaticScale_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->electrostaticScale_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar3 != pdVar4) {
    memset(pdVar3,0,((long)pdVar4 + (-8 - (long)pdVar3) & 0xfffffffffffffff8U) + 8);
  }
  pdVar4 = (this->vdwScale_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar4 = 1.0;
  pdVar4[1] = (pFVar2->forceFieldOptions_).vdw12scale.data_;
  pdVar4[2] = (pFVar2->forceFieldOptions_).vdw13scale.data_;
  pdVar4[3] = (pFVar2->forceFieldOptions_).vdw14scale.data_;
  *pdVar3 = 1.0;
  pdVar3[1] = (pFVar2->forceFieldOptions_).electrostatic12scale.data_;
  pdVar3[2] = (pFVar2->forceFieldOptions_).electrostatic13scale.data_;
  pdVar3[3] = (pFVar2->forceFieldOptions_).electrostatic14scale.data_;
  pSVar13 = this->info_;
  pGVar9 = pSVar13->simParams_;
  if ((pGVar9->UniformField).super_ParameterBase.empty_ == false) {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(0x38);
    UniformField::UniformField((UniformField *)paVar7,pSVar13);
    local_50._16_8_ = paVar7;
    std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
    emplace_back<OpenMD::ForceModifier*>
              ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
               &this->forceModifiers_,(ForceModifier **)(local_50 + 0x10));
    pSVar13 = this->info_;
    pGVar9 = pSVar13->simParams_;
  }
  if ((pGVar9->MagneticField).super_ParameterBase.empty_ == false) {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(0x38);
    MagneticField::MagneticField((MagneticField *)paVar7,pSVar13);
    local_50._16_8_ = paVar7;
    std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
    emplace_back<OpenMD::ForceModifier*>
              ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
               &this->forceModifiers_,(ForceModifier **)(local_50 + 0x10));
    pSVar13 = this->info_;
    pGVar9 = pSVar13->simParams_;
  }
  if ((((pGVar9->UniformGradientStrength).super_ParameterBase.empty_ != true) ||
      ((pGVar9->UniformGradientDirection1).super_ParameterBase.empty_ != true)) ||
     ((pGVar9->UniformGradientDirection2).super_ParameterBase.empty_ == false)) {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(0xa8);
    UniformGradient::UniformGradient((UniformGradient *)paVar7,pSVar13);
    local_50._16_8_ = paVar7;
    std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
    emplace_back<OpenMD::ForceModifier*>
              ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
               &this->forceModifiers_,(ForceModifier **)(local_50 + 0x10));
    pSVar13 = this->info_;
    pGVar9 = pSVar13->simParams_;
  }
  pLVar11 = pGVar9->lightPars_;
  if ((pLVar11->UseLight).super_ParameterBase.field_0x2b == '\x01') {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(0x120);
    Perturbations::Light::Light((Light *)paVar7,pSVar13);
    local_50._16_8_ = paVar7;
    std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
    emplace_back<OpenMD::ForceModifier*>
              ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
               &this->forceModifiers_,(ForceModifier **)(local_50 + 0x10));
    pSVar13 = this->info_;
    pGVar9 = pSVar13->simParams_;
  }
  if ((pGVar9->UseThermodynamicIntegration).super_ParameterBase.field_0x2b == '\x01') {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(0xd0);
    ThermoIntegrationForceModifier::ThermoIntegrationForceModifier
              ((ThermoIntegrationForceModifier *)paVar7,pSVar13);
LAB_002151b7:
    local_50._16_8_ = paVar7;
    std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
    emplace_back<OpenMD::ForceModifier*>
              ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
               &this->forceModifiers_,(ForceModifier **)(local_50 + 0x10));
  }
  else if ((pGVar9->UseRestraints).super_ParameterBase.field_0x2b == '\x01') {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(0xb8);
    RestraintForceModifier::RestraintForceModifier((RestraintForceModifier *)paVar7,pSVar13);
    goto LAB_002151b7;
  }
  pGVar9 = this->info_->simParams_;
  pcVar1 = (pGVar9->Ensemble).data_._M_dataplus._M_p;
  local_60._0_8_ = (ZConstraintForceModifier *)local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + (pGVar9->Ensemble).data_._M_string_length);
  std::locale::locale((locale *)auStack_68);
  toUpperCopy<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_50 + 0x10),
             (OpenMD *)local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_68,
             (locale *)pLVar11);
  std::locale::~locale((locale *)auStack_68);
  if ((ZConstraintForceModifier *)local_60._0_8_ != (ZConstraintForceModifier *)local_50) {
    operator_delete((void *)local_60._0_8_,local_50._0_8_ + 1);
  }
  iVar6 = std::__cxx11::string::compare(local_50 + 0x10);
  if (iVar6 != 0) {
    iVar6 = std::__cxx11::string::compare(local_50 + 0x10);
    if (iVar6 != 0) {
      iVar6 = std::__cxx11::string::compare(local_50 + 0x10);
      if (iVar6 != 0) {
        iVar6 = std::__cxx11::string::compare(local_50 + 0x10);
        if (iVar6 != 0) {
          iVar6 = std::__cxx11::string::compare(local_50 + 0x10);
          if (iVar6 != 0) goto LAB_00215302;
        }
        pZVar8 = (ZConstraintForceModifier *)operator_new(0x110);
        LDForceModifier::LDForceModifier((LDForceModifier *)pZVar8,this->info_);
        local_60._0_8_ = pZVar8;
        std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
        emplace_back<OpenMD::ForceModifier*>
                  ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
                   &this->forceModifiers_,(ForceModifier **)local_60);
        goto LAB_00215302;
      }
    }
  }
  memcpy(&painCave,
         "ForceManager: Cannot use the LangevinHull ensembles without qhull.\n\tPlease rebuild OpenMD with qhull enabled."
         ,0x6e);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
LAB_00215302:
  pSVar13 = this->info_;
  pGVar9 = pSVar13->simParams_;
  uVar12 = (long)(pGVar9->zconstraints_).
                 super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pGVar9->zconstraints_).
                 super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (uVar12 != 0) {
    pSVar13->nZconstraint_ = (int)(uVar12 >> 3);
    pZVar8 = (ZConstraintForceModifier *)operator_new(0x110);
    ZConstraintForceModifier::ZConstraintForceModifier(pZVar8,pSVar13);
    local_60._0_8_ = pZVar8;
    std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>::
    emplace_back<OpenMD::ForceModifier*>
              ((vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>> *)
               &this->forceModifiers_,(ForceModifier **)local_60);
    pGVar9 = this->info_->simParams_;
  }
  this->usePeriodicBoundaryConditions_ =
       (bool)(pGVar9->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  (*this->fDecomp_->_vptr_ForceDecomposition[3])();
  this->doPotentialSelection_ = false;
  pGVar9 = this->info_->simParams_;
  if ((pGVar9->PotentialSelection).super_ParameterBase.empty_ == false) {
    this->doPotentialSelection_ = true;
    pcVar1 = (pGVar9->PotentialSelection).data_._M_dataplus._M_p;
    local_60._0_8_ = (ZConstraintForceModifier *)local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar1,
               pcVar1 + (pGVar9->PotentialSelection).data_._M_string_length);
    std::__cxx11::string::operator=((string *)&this->selectionScript_,(string *)local_60);
    if ((ZConstraintForceModifier *)local_60._0_8_ != (ZConstraintForceModifier *)local_50) {
      operator_delete((void *)local_60._0_8_,local_50._0_8_ + 1);
    }
    SelectionEvaluator::loadScriptString(&this->evaluator_,&this->selectionScript_);
    if ((this->evaluator_).isDynamic_ == false) {
      SelectionEvaluator::evaluate((SelectionSet *)local_60,&this->evaluator_);
      lVar14 = 0;
      do {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  ((vector<bool,_std::allocator<bool>_> *)
                   ((long)&(((this->seleMan_).ss_.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar14)
                   ,(vector<bool,_std::allocator<bool>_> *)
                    ((long)&((ForceModifier *)local_60._0_8_)->_vptr_ForceModifier + lVar14));
        lVar14 = lVar14 + 0x28;
      } while (lVar14 != 0xf0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_60);
    }
  }
  this->initialized_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._16_8_ != &local_30) {
    operator_delete((void *)local_50._16_8_,local_30._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ForceManager::initialize() {
    if (!info_->isTopologyDone()) {
      info_->update();
      interactionMan_->setSimInfo(info_);
      interactionMan_->initialize();

      useSurfaceTerm_  = false;  // default, can be set by Ewald or directly
      useSlabGeometry_ = false;

      //! We want to delay the cutoffs until after the interaction
      //! manager has set up the atom-atom interactions so that we can
      //! query them for suggested cutoff values
      setupCutoffs();

      info_->prepareTopology();

      doParticlePot_ = info_->getSimParams()->getOutputParticlePotential();
      doHeatFlux_    = info_->getSimParams()->getPrintHeatFlux();
      if (doHeatFlux_) doParticlePot_ = true;

      doElectricField_ = info_->getSimParams()->getOutputElectricField();
      doElectricField_ |=
          info_->getSimParams()->getRNEMDParameters()->requiresElectricField();
      doSitePotential_ = info_->getSimParams()->getOutputSitePotential();
      if (info_->getSimParams()->haveUseSurfaceTerm() &&
          info_->getSimParams()->getUseSurfaceTerm()) {
        if (info_->usesElectrostaticAtoms()) {
          useSurfaceTerm_ = info_->getSimParams()->getUseSurfaceTerm();
          if (info_->getSimParams()->haveUseSlabGeometry()) {
            useSlabGeometry_ = info_->getSimParams()->getUseSlabGeometry();

            string axis =
                toUpperCopy(info_->getSimParams()->getPrivilegedAxis());
            if (axis.compare("X") == 0)
              axis_ = 0;
            else if (axis.compare("Y") == 0)
              axis_ = 1;
            else
              axis_ = 2;
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "ForceManager::initialize : useSurfaceTerm was set true\n"
                   "\tbut no electrostatic atoms are present. OpenMD will\n"
                   "\tignore this setting.\n");
          painCave.isFatal  = 0;
          painCave.severity = OPENMD_WARNING;
          simError();
        }
      }
    }

    ForceFieldOptions& fopts = forceField_->getForceFieldOptions();

    //! Force fields can set options on how to scale van der Waals and
    //! electrostatic interactions for atoms connected via bonds, bends
    //! and torsions in this case the topological distance between
    //! atoms is:
    //! 0 = topologically unconnected
    //! 1 = bonded together
    //! 2 = connected via a bend
    //! 3 = connected via a torsion

    vdwScale_.reserve(4);
    fill(vdwScale_.begin(), vdwScale_.end(), 0.0);

    electrostaticScale_.reserve(4);
    fill(electrostaticScale_.begin(), electrostaticScale_.end(), 0.0);

    vdwScale_[0] = 1.0;
    vdwScale_[1] = fopts.getvdw12scale();
    vdwScale_[2] = fopts.getvdw13scale();
    vdwScale_[3] = fopts.getvdw14scale();

    electrostaticScale_[0] = 1.0;
    electrostaticScale_[1] = fopts.getelectrostatic12scale();
    electrostaticScale_[2] = fopts.getelectrostatic13scale();
    electrostaticScale_[3] = fopts.getelectrostatic14scale();

    // Initialize the perturbations
    if (info_->getSimParams()->haveUniformField()) {
      UniformField* eField = new UniformField(info_);
      forceModifiers_.push_back(eField);
    }

    if (info_->getSimParams()->haveMagneticField()) {
      MagneticField* mField = new MagneticField(info_);
      forceModifiers_.push_back(mField);
    }

    if (info_->getSimParams()->haveUniformGradientStrength() ||
        info_->getSimParams()->haveUniformGradientDirection1() ||
        info_->getSimParams()->haveUniformGradientDirection2()) {
      UniformGradient* eGrad = new UniformGradient(info_);
      forceModifiers_.push_back(eGrad);
    }

    if (info_->getSimParams()->getLightParameters()->getUseLight()) {
      Perturbations::Light* light = new Perturbations::Light(info_);
      forceModifiers_.push_back(light);
    }

    // Initialize the force modifiers (order matters)
    if (info_->getSimParams()->getUseThermodynamicIntegration()) {
      ThermoIntegrationForceModifier* thermoInt =
          new ThermoIntegrationForceModifier(info_);
      forceModifiers_.push_back(thermoInt);
    } else if (info_->getSimParams()->getUseRestraints()) {
      RestraintForceModifier* restraint = new RestraintForceModifier(info_);
      forceModifiers_.push_back(restraint);
    }

    std::string ensembleParam =
        toUpperCopy(info_->getSimParams()->getEnsemble());

    if (ensembleParam == "LHULL" || ensembleParam == "LANGEVINHULL" ||
        ensembleParam == "SMIPD") {
#if defined(HAVE_QHULL)
      LangevinHullForceModifier* langevinHullFM =
          new LangevinHullForceModifier(info_);
      forceModifiers_.push_back(langevinHullFM);
#else
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "ForceManager: Cannot use the LangevinHull ensembles without qhull.\n"
          "\tPlease rebuild OpenMD with qhull enabled.");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
#endif
    } else if (ensembleParam == "LANGEVINDYNAMICS" || ensembleParam == "LD") {
      LDForceModifier* langevinDynamicsFM = new LDForceModifier(info_);
      forceModifiers_.push_back(langevinDynamicsFM);
    }

    if (info_->getSimParams()->getNZconsStamps() > 0) {
      info_->setNZconstraint(info_->getSimParams()->getNZconsStamps());
      ZConstraintForceModifier* zCons = new ZConstraintForceModifier(info_);
      forceModifiers_.push_back(zCons);
    }

    usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    fDecomp_->distributeInitialData();

    doPotentialSelection_ = false;
    if (info_->getSimParams()->havePotentialSelection()) {
      doPotentialSelection_ = true;
      selectionScript_      = info_->getSimParams()->getPotentialSelection();
      evaluator_.loadScriptString(selectionScript_);
      if (!evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }
    }

    initialized_ = true;
  }